

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void upb_Message_Freeze(upb_Message *msg,upb_MiniTable *m)

{
  upb_Message_Internal ptr;
  upb_MiniTableExtension *e_00;
  _Bool _Var1;
  int iVar2;
  upb_FieldMode uVar3;
  upb_MiniTableField *puVar4;
  upb_MiniTable *puVar5;
  upb_Array *puVar6;
  upb_Map *map_00;
  upb_Message *msg_00;
  upb_Message_Internal *puVar7;
  upb_Extension *puVar8;
  uint local_d0;
  upb_Message *msg2_1;
  upb_Array *arr_1;
  upb_MessageValue val;
  upb_MiniTable *m2_1;
  upb_MiniTableField *f_1;
  upb_MiniTableExtension *e;
  upb_Extension *ext;
  upb_TaggedAuxPtr tagged_ptr;
  size_t i_1;
  uint32_t size;
  upb_Message_Internal *in;
  upb_Message *msg2;
  upb_MiniTable *m3;
  upb_MiniTableField *f2;
  upb_Map *map;
  upb_Array *arr;
  upb_MiniTable *m2;
  upb_MiniTableField *f;
  size_t i;
  size_t field_count;
  upb_MiniTable *m_local;
  upb_Message *msg_local;
  
  _Var1 = upb_Message_IsFrozen(msg);
  if (!_Var1) {
    _upb_Message_ShallowFreeze_dont_copy_me__upb_internal_use_only(msg);
    iVar2 = upb_MiniTable_FieldCount(m);
    for (f = (upb_MiniTableField *)0x0; f < (upb_MiniTableField *)(long)iVar2;
        f = (upb_MiniTableField *)((long)&f->number_dont_copy_me__upb_internal_use_only + 1)) {
      puVar4 = upb_MiniTable_GetFieldByIndex(m,(uint32_t)f);
      puVar5 = upb_MiniTable_SubMessage(m,puVar4);
      uVar3 = _upb_MiniTableField_Mode_dont_copy_me__upb_internal_use_only(puVar4);
      if (uVar3 == kUpb_FieldMode_Map) {
        map_00 = upb_Message_GetMutableMap(msg,puVar4);
        if (map_00 != (upb_Map *)0x0) {
          puVar4 = upb_MiniTable_MapValue(puVar5);
          puVar5 = upb_MiniTable_SubMessage(puVar5,puVar4);
          upb_Map_Freeze(map_00,puVar5);
        }
      }
      else if (uVar3 == kUpb_FieldMode_Array) {
        puVar6 = upb_Message_GetMutableArray(msg,puVar4);
        if (puVar6 != (upb_Array *)0x0) {
          upb_Array_Freeze(puVar6,puVar5);
        }
      }
      else if (((uVar3 == kUpb_FieldMode_Scalar) && (puVar5 != (upb_MiniTable *)0x0)) &&
              (msg_00 = upb_Message_GetMutableMessage(msg,puVar4), msg_00 != (upb_Message *)0x0)) {
        upb_Message_Freeze(msg_00,puVar5);
      }
    }
    puVar7 = _upb_Message_GetInternal_dont_copy_me__upb_internal_use_only(msg);
    if (puVar7 == (upb_Message_Internal *)0x0) {
      local_d0 = 0;
    }
    else {
      local_d0 = puVar7->size;
    }
    for (tagged_ptr.ptr = 0; tagged_ptr.ptr < local_d0; tagged_ptr.ptr = tagged_ptr.ptr + 1) {
      ptr = puVar7[tagged_ptr.ptr + 1];
      _Var1 = upb_TaggedAuxPtr_IsExtension((upb_TaggedAuxPtr)ptr);
      if (_Var1) {
        puVar8 = upb_TaggedAuxPtr_Extension((upb_TaggedAuxPtr)ptr);
        e_00 = puVar8->ext;
        puVar5 = upb_MiniTableExtension_GetSubMessage(e_00);
        puVar6 = (puVar8->data).array_val;
        uVar3 = _upb_MiniTableField_Mode_dont_copy_me__upb_internal_use_only
                          (&e_00->field_dont_copy_me__upb_internal_use_only);
        if (uVar3 == kUpb_FieldMode_Map) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                        ,0x131,"void upb_Message_Freeze(upb_Message *, const upb_MiniTable *)");
        }
        if (uVar3 == kUpb_FieldMode_Array) {
          if (puVar6 != (upb_Array *)0x0) {
            upb_Array_Freeze(puVar6,puVar5);
          }
        }
        else if (((uVar3 == kUpb_FieldMode_Scalar) &&
                 (_Var1 = upb_MiniTableField_IsSubMessage
                                    (&e_00->field_dont_copy_me__upb_internal_use_only), _Var1)) &&
                (puVar6 != (upb_Array *)0x0)) {
          upb_Message_Freeze((upb_Message *)puVar6,puVar5);
        }
      }
    }
  }
  return;
}

Assistant:

void upb_Message_Freeze(upb_Message* msg, const upb_MiniTable* m) {
  if (upb_Message_IsFrozen(msg)) return;
  UPB_PRIVATE(_upb_Message_ShallowFreeze)(msg);

  // Base Fields.
  const size_t field_count = upb_MiniTable_FieldCount(m);

  for (size_t i = 0; i < field_count; i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    const upb_MiniTable* m2 = upb_MiniTable_SubMessage(m, f);

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = upb_Message_GetMutableArray(msg, f);
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map: {
        upb_Map* map = upb_Message_GetMutableMap(msg, f);
        if (map) {
          const upb_MiniTableField* f2 = upb_MiniTable_MapValue(m2);
          const upb_MiniTable* m3 = upb_MiniTable_SubMessage(m2, f2);
          upb_Map_Freeze(map, m3);
        }
        break;
      }
      case kUpb_FieldMode_Scalar: {
        if (m2) {
          upb_Message* msg2 = upb_Message_GetMutableMessage(msg, f);
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
      }
    }
  }

  // Extensions.
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  // TODO: b/376969853 - use iterator API
  uint32_t size = in ? in->size : 0;
  for (size_t i = 0; i < size; i++) {
    upb_TaggedAuxPtr tagged_ptr = in->aux_data[i];
    if (!upb_TaggedAuxPtr_IsExtension(tagged_ptr)) {
      continue;
    }
    const upb_Extension* ext = upb_TaggedAuxPtr_Extension(tagged_ptr);
    const upb_MiniTableExtension* e = ext->ext;
    const upb_MiniTableField* f = &e->UPB_PRIVATE(field);
    const upb_MiniTable* m2 = upb_MiniTableExtension_GetSubMessage(e);

    upb_MessageValue val;
    memcpy(&val, &(ext->data), sizeof(upb_MessageValue));

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = (upb_Array*)val.array_val;
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map:
        UPB_UNREACHABLE();  // Maps cannot be extensions.
        break;
      case kUpb_FieldMode_Scalar:
        if (upb_MiniTableField_IsSubMessage(f)) {
          upb_Message* msg2 = (upb_Message*)val.msg_val;
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
    }
  }
}